

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

void jsons_print_feature(lyout *out,lys_feature *feat,int *first)

{
  char *pcVar1;
  ulong uVar2;
  int local_34 [2];
  int f;
  
  local_34[0] = 1;
  if (first == (int *)0x0) {
    pcVar1 = ",";
  }
  else {
    pcVar1 = "";
    if (*first == 0) {
      pcVar1 = ",";
    }
  }
  ly_print(out,"%s\"%s\":{",pcVar1,feat->name);
  jsons_print_text(out,"description","text",feat->dsc,1,local_34);
  jsons_print_text(out,"reference","text",feat->ref,1,local_34);
  jsons_print_status(out,feat->flags,local_34);
  jsons_print_iffeatures(out,feat->module,feat->iffeature,feat->iffeature_size,local_34);
  if ((feat->depfeatures != (ly_set *)0x0) && (feat->depfeatures->number != 0)) {
    pcVar1 = "";
    if (local_34[0] == 0) {
      pcVar1 = ",";
    }
    ly_print(out,"%s\"depending-features\":[",pcVar1);
    for (uVar2 = 0; uVar2 < feat->depfeatures->number; uVar2 = uVar2 + 1) {
      pcVar1 = ",";
      if (uVar2 == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s\"%s\"",pcVar1,(feat->depfeatures->set).s[uVar2]->name);
    }
    ly_print(out,"]");
  }
  ly_print(out,"}");
  if (first != (int *)0x0) {
    *first = 0;
  }
  return;
}

Assistant:

static void
jsons_print_feature(struct lyout *out, const struct lys_feature *feat, int *first)
{
    int f = 1;
    unsigned int j;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", feat->name);
    jsons_print_text(out, "description", "text", feat->dsc, 1, &f);
    jsons_print_text(out, "reference", "text", feat->ref, 1, &f);
    jsons_print_status(out, feat->flags, &f);
    jsons_print_iffeatures(out, feat->module, feat->iffeature, feat->iffeature_size, &f);
    if (feat->depfeatures && feat->depfeatures->number) {
        ly_print(out, "%s\"depending-features\":[", f ? "" : ",");
        for (j = 0; j < feat->depfeatures->number; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", ((struct lys_feature*)(feat->depfeatures->set.g[j]))->name);
        }
        ly_print(out, "]");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}